

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall
QTableModel::dropMimeData
          (QTableModel *this,QMimeData *data,DropAction action,int row,int column,QModelIndex *index
          )

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  QTableWidget *pQVar4;
  int iVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QModelIndex::isValid(index);
  if (bVar2) {
    row = index->r;
    iVar5 = index->c;
  }
  else {
    iVar5 = 0;
    if (row == -1 || column == -1) {
      row = (**(code **)(*(long *)this + 0x78))(this);
    }
  }
  pQVar4 = view(this);
  if (pQVar4 == (QTableWidget *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (**(code **)(*(long *)&(pQVar4->super_QTableView).super_QAbstractItemView.
                                   super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x310))
                      (pQVar4,row,iVar5,data,action);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::dropMimeData(const QMimeData *data, Qt::DropAction action,
                              int row , int column, const QModelIndex &index)
{
    if (index.isValid()) {
        row = index.row();
        column = index.column();
    } else if (row == -1 || column == -1) { // The user dropped outside the table.
        row = rowCount();
        column = 0;
    } else { // The user dropped between two rows
        // This means inserting a row, which only makes sense at column 0
        column = 0;
    }

    QTableWidget *view = this->view();
    return (view ? view->dropMimeData(row, column, data, action) : false);
}